

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.c
# Opt level: O3

int sub0_pipe_start(void *arg)

{
  uint16_t uVar1;
  int iVar2;
  
  uVar1 = nni_pipe_peer(*arg);
  if (uVar1 == 0x20) {
    nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x10));
    iVar2 = 0;
  }
  else {
    uVar1 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar1,0x20
                );
    iVar2 = 0xd;
  }
  return iVar2;
}

Assistant:

static int
sub0_pipe_start(void *arg)
{
	sub0_pipe *p = arg;

	if (nni_pipe_peer(p->pipe) != NNI_PROTO_PUB_V0) {
		// Peer protocol mismatch.
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), NNI_PROTO_PUB_V0);
		return (NNG_EPROTO);
	}

	nni_pipe_recv(p->pipe, &p->aio_recv);
	return (0);
}